

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImDrawList *pIVar1;
  float *pfVar2;
  ImGuiNavMoveResult *pIVar3;
  int *piVar4;
  ImGuiNextWindowData *pIVar5;
  ImVec2 *pIVar6;
  ImVec2 *pIVar7;
  ImFontAtlas *pIVar8;
  ImGuiWindow **ppIVar9;
  ImGuiPopupData *pIVar10;
  byte bVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  ImGuiID IVar14;
  bool bVar15;
  bool bVar16;
  int i;
  uint uVar17;
  ImGuiID IVar18;
  ImGuiInputSource IVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  ImGuiWindow *pIVar23;
  ImGuiWindow **__dest;
  ImGuiPopupData *__dest_00;
  int i_1;
  ImGuiID IVar24;
  ImGuiWindow *window;
  char *pcVar25;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar26;
  long lVar27;
  ulong uVar28;
  int i_2;
  ImGuiDir IVar29;
  ImGuiNavMoveResult *pIVar30;
  ImGuiID IVar31;
  float *pfVar32;
  long lVar33;
  ulong uVar34;
  ImGuiNavLayer IVar35;
  ImGuiID IVar36;
  ImFont *font;
  float *pfVar37;
  ImGuiContext *g;
  ImGuiContext *g_1;
  bool *pbVar38;
  ImGuiContext *pIVar39;
  ImGuiContext *g_2;
  bool bVar40;
  byte bVar41;
  uint uVar42;
  float fVar43;
  ImVec2 IVar44;
  ImVec2 IVar45;
  ImVec2 IVar46;
  ImVec2 IVar47;
  ImVec2 IVar48;
  ImVec2 IVar50;
  double dVar49;
  undefined1 auVar51 [16];
  float fVar52;
  ImVec2 IVar54;
  float fVar53;
  ImVec2 IVar55;
  ImVec2 IVar56;
  float fVar59;
  float fVar60;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ImRect rect_abs;
  ImRect local_70;
  ImGuiContext *local_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImRect local_40;
  
  pIVar39 = GImGui;
  bVar41 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe3d,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe25,"void NewFrameSanityChecks()");
  }
  fVar63 = (GImGui->IO).DeltaTime;
  iVar21 = GImGui->FrameCount;
  if (fVar63 <= 0.0) {
    if (iVar21 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0xe26,"void NewFrameSanityChecks()");
    }
  }
  else if ((iVar21 != 0) && (GImGui->FrameCountEnded != iVar21)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe27,"void NewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe28,"void NewFrameSanityChecks()");
  }
  pIVar8 = (GImGui->IO).Fonts;
  if ((pIVar8->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe29,"void NewFrameSanityChecks()");
  }
  if ((*(pIVar8->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2a,"void NewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2b,"void NewFrameSanityChecks()");
  }
  fVar52 = (GImGui->Style).Alpha;
  if ((fVar52 < 0.0) || (1.0 < fVar52)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2c,"void NewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2d,"void NewFrameSanityChecks()");
  }
  if (1 < (uint)(GImGui->Style).WindowMenuButtonPosition) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2e,"void NewFrameSanityChecks()");
  }
  lVar22 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar22] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0xe30,"void NewFrameSanityChecks()");
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe34,"void NewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar39->SettingsLoaded == false) {
    if ((pIVar39->SettingsWindows).Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0xe4a,"void ImGui::NewFrame()");
    }
    pcVar25 = (pIVar39->IO).IniFilename;
    if (pcVar25 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar25);
      fVar63 = (pIVar39->IO).DeltaTime;
    }
    pIVar39->SettingsLoaded = true;
  }
  if ((0.0 < pIVar39->SettingsDirtyTimer) &&
     (fVar52 = pIVar39->SettingsDirtyTimer - fVar63, pIVar39->SettingsDirtyTimer = fVar52,
     fVar52 <= 0.0)) {
    pcVar25 = (pIVar39->IO).IniFilename;
    if (pcVar25 == (char *)0x0) {
      (pIVar39->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar25);
      fVar63 = (pIVar39->IO).DeltaTime;
    }
    pIVar39->SettingsDirtyTimer = 0.0;
  }
  pIVar39->Time = (double)fVar63 + pIVar39->Time;
  pIVar39->FrameScopeActive = true;
  pIVar39->FrameCount = pIVar39->FrameCount + 1;
  pIVar39->TooltipOverrideCount = 0;
  pIVar39->WindowsActiveCount = 0;
  ((pIVar39->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar8 = (GImGui->IO).Fonts;
    if ((pIVar8->Fonts).Size < 1) {
      pcVar25 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_0013e2bd:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                    ,0x4d8,pcVar25);
    }
    font = *(pIVar8->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar39->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe67,"void ImGui::NewFrame()");
  }
  fVar63 = (pIVar39->IO).DisplaySize.x;
  fVar52 = (pIVar39->IO).DisplaySize.y;
  (pIVar39->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar39->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar39->DrawListSharedData).ClipRectFullscreen.z = fVar63;
  (pIVar39->DrawListSharedData).ClipRectFullscreen.w = fVar52;
  (pIVar39->DrawListSharedData).CurveTessellationTol = (pIVar39->Style).CurveTessellationTol;
  bVar40 = (pIVar39->Style).AntiAliasedLines;
  uVar17 = (uint)bVar40;
  (pIVar39->DrawListSharedData).InitialFlags = (uint)bVar40;
  if ((pIVar39->Style).AntiAliasedFill == true) {
    uVar17 = bVar40 | 2;
    (pIVar39->DrawListSharedData).InitialFlags = uVar17;
  }
  if (((pIVar39->IO).BackendFlags & 8) != 0) {
    (pIVar39->DrawListSharedData).InitialFlags = uVar17 | 4;
  }
  pIVar1 = &pIVar39->BackgroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar39->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  pIVar1 = &pIVar39->ForegroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar39->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar39->DrawData).Valid = false;
  (pIVar39->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar39->DrawData).CmdListsCount = 0;
  (pIVar39->DrawData).TotalIdxCount = 0;
  (pIVar39->DrawData).TotalVtxCount = 0;
  (pIVar39->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar39->DrawData).DisplayPos.y = 0;
  (pIVar39->DrawData).DisplaySize.x = 0.0;
  (pIVar39->DrawData).DisplaySize.y = 0.0;
  (pIVar39->DrawData).FramebufferScale.x = 0.0;
  pIVar12 = GImGui;
  (pIVar39->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar39->DragDropActive == true) &&
     (IVar24 = (pIVar39->DragDropPayload).SourceId, IVar24 == pIVar39->ActiveId)) {
    if (GImGui->ActiveId == IVar24) {
      GImGui->ActiveIdIsAlive = IVar24;
    }
    if (pIVar12->ActiveIdPreviousFrame == IVar24) {
      pIVar12->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar39->HoveredIdPreviousFrame == 0) {
    IVar24 = pIVar39->HoveredId;
    pIVar39->HoveredIdTimer = 0.0;
    pIVar39->HoveredIdNotActiveTimer = 0.0;
    if (IVar24 == 0) goto LAB_0013ba61;
LAB_0013ba36:
    fVar63 = (pIVar39->IO).DeltaTime;
    pIVar39->HoveredIdTimer = pIVar39->HoveredIdTimer + fVar63;
    IVar18 = IVar24;
    if (pIVar39->ActiveId != IVar24) {
      pIVar39->HoveredIdNotActiveTimer = fVar63 + pIVar39->HoveredIdNotActiveTimer;
      IVar18 = pIVar39->ActiveId;
    }
  }
  else {
    IVar24 = pIVar39->HoveredId;
    if (IVar24 != 0) {
      if (pIVar39->ActiveId == IVar24) {
        pIVar39->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0013ba36;
    }
LAB_0013ba61:
    IVar24 = 0;
    IVar18 = pIVar39->ActiveId;
  }
  pIVar39->HoveredIdPreviousFrame = IVar24;
  pIVar39->HoveredId = 0;
  pIVar39->HoveredIdAllowOverlap = false;
  pIVar12 = GImGui;
  if (((pIVar39->ActiveIdIsAlive != IVar18) && (IVar18 != 0)) &&
     (pIVar39->ActiveIdPreviousFrame == IVar18)) {
    bVar40 = GImGui->ActiveId != 0;
    GImGui->ActiveIdIsJustActivated = bVar40;
    if (bVar40) {
      pIVar12->ActiveIdTimer = 0.0;
      pIVar12->ActiveIdHasBeenPressedBefore = false;
      pIVar12->ActiveIdHasBeenEditedBefore = false;
    }
    pIVar12->ActiveId = 0;
    pIVar12->ActiveIdAllowNavDirFlags = 0;
    pIVar12->ActiveIdBlockNavInputFlags = 0;
    pIVar12->ActiveIdAllowOverlap = false;
    pIVar12->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar12->ActiveIdHasBeenEditedThisFrame = false;
    IVar18 = pIVar39->ActiveId;
  }
  fVar63 = (pIVar39->IO).DeltaTime;
  if (IVar18 != 0) {
    pIVar39->ActiveIdTimer = pIVar39->ActiveIdTimer + fVar63;
  }
  pIVar39->LastActiveIdTimer = pIVar39->LastActiveIdTimer + fVar63;
  pIVar39->ActiveIdPreviousFrame = IVar18;
  pIVar39->ActiveIdPreviousFrameWindow = pIVar39->ActiveIdWindow;
  pIVar39->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar39->ActiveIdHasBeenEditedBefore;
  pIVar39->ActiveIdIsAlive = 0;
  pIVar39->ActiveIdHasBeenEditedThisFrame = false;
  pIVar39->ActiveIdPreviousFrameIsAlive = false;
  pIVar39->ActiveIdIsJustActivated = false;
  if ((pIVar39->TempInputTextId != 0) && (IVar18 != pIVar39->TempInputTextId)) {
    pIVar39->TempInputTextId = 0;
  }
  pIVar39->DragDropAcceptIdPrev = pIVar39->DragDropAcceptIdCurr;
  pIVar39->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar39->DragDropAcceptIdCurr = 0;
  pIVar39->DragDropWithinSourceOrTarget = false;
  pfVar2 = (pIVar39->IO).KeysDownDuration;
  memcpy((pIVar39->IO).KeysDownDurationPrev,pfVar2,0x800);
  lVar22 = 0;
  do {
    fVar52 = -1.0;
    if ((pIVar39->IO).KeysDown[lVar22] == true) {
      fVar52 = 0.0;
      if (0.0 <= pfVar2[lVar22]) {
        fVar52 = pfVar2[lVar22] + fVar63;
      }
    }
    pfVar2[lVar22] = fVar52;
    pIVar12 = GImGui;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x200);
  (GImGui->IO).WantSetMousePos = false;
  uVar17 = (pIVar12->IO).ConfigFlags;
  local_60 = pIVar39;
  if (((uVar17 & 2) == 0) || (((pIVar12->IO).BackendFlags & 1) == 0)) {
    bVar11 = 0;
  }
  else if ((((0.0 < (pIVar12->IO).NavInputs[0]) || (0.0 < (pIVar12->IO).NavInputs[2])) ||
           (0.0 < (pIVar12->IO).NavInputs[1])) || (bVar11 = 1, 0.0 < (pIVar12->IO).NavInputs[3])) {
    pIVar12->NavInputSource = ImGuiInputSource_NavGamepad;
    bVar11 = 1;
  }
  if ((uVar17 & 1) != 0) {
    uVar42 = (pIVar12->IO).KeyMap[0xc];
    if (-1 < (long)(int)uVar42) {
      if (0x1ff < uVar42) goto LAB_0013e2c7;
      if ((pIVar12->IO).KeysDown[(int)uVar42] == true) {
        (pIVar12->IO).NavInputs[0] = 1.0;
        pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar42 = (pIVar12->IO).KeyMap[0xd];
    if (-1 < (long)(int)uVar42) {
      if (0x1ff < uVar42) goto LAB_0013e2c7;
      if ((pIVar12->IO).KeysDown[(int)uVar42] == true) {
        (pIVar12->IO).NavInputs[2] = 1.0;
        pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar42 = (pIVar12->IO).KeyMap[0xe];
    if (-1 < (long)(int)uVar42) {
      if (0x1ff < uVar42) goto LAB_0013e2c7;
      if ((pIVar12->IO).KeysDown[(int)uVar42] == true) {
        (pIVar12->IO).NavInputs[1] = 1.0;
        pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar42 = (pIVar12->IO).KeyMap[1];
    if (-1 < (long)(int)uVar42) {
      if (0x1ff < uVar42) goto LAB_0013e2c7;
      if ((pIVar12->IO).KeysDown[(int)uVar42] == true) {
        (pIVar12->IO).NavInputs[0x12] = 1.0;
        pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar42 = (pIVar12->IO).KeyMap[2];
    if (-1 < (long)(int)uVar42) {
      if (0x1ff < uVar42) goto LAB_0013e2c7;
      if ((pIVar12->IO).KeysDown[(int)uVar42] == true) {
        (pIVar12->IO).NavInputs[0x13] = 1.0;
        pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar42 = (pIVar12->IO).KeyMap[3];
    if (-1 < (long)(int)uVar42) {
      if (0x1ff < uVar42) goto LAB_0013e2c7;
      if ((pIVar12->IO).KeysDown[(int)uVar42] == true) {
        (pIVar12->IO).NavInputs[0x14] = 1.0;
        pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar42 = (pIVar12->IO).KeyMap[4];
    if (-1 < (long)(int)uVar42) {
      if (0x1ff < uVar42) goto LAB_0013e2c7;
      if ((pIVar12->IO).KeysDown[(int)uVar42] == true) {
        (pIVar12->IO).NavInputs[0x15] = 1.0;
        pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar42 = (pIVar12->IO).KeyMap[0];
    if (-1 < (long)(int)uVar42) {
      if (0x1ff < uVar42) {
LAB_0013e2c7:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(GImGui->IO.KeysDown)/sizeof(*GImGui->IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                      ,0x10f5,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar12->IO).KeysDown[(int)uVar42] == true) {
        (pIVar12->IO).NavInputs[0x11] = 1.0;
        pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar40 = (pIVar12->IO).KeyCtrl;
    if (bVar40 == true) {
      (pIVar12->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar12->IO).KeyShift == true) {
      (pIVar12->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar40 == false) && ((pIVar12->IO).KeyAlt != false)) {
      (pIVar12->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar2 = (pIVar12->IO).NavInputsDownDuration;
  pfVar32 = pfVar2;
  pfVar37 = (pIVar12->IO).NavInputsDownDurationPrev;
  for (lVar22 = 0xb; lVar22 != 0; lVar22 = lVar22 + -1) {
    *(undefined8 *)pfVar37 = *(undefined8 *)pfVar32;
    pfVar32 = pfVar32 + (ulong)bVar41 * -4 + 2;
    pfVar37 = pfVar37 + (ulong)bVar41 * -4 + 2;
  }
  lVar22 = 0;
  do {
    fVar63 = -1.0;
    if (0.0 < (pIVar12->IO).NavInputs[lVar22]) {
      fVar63 = 0.0;
      if (0.0 <= pfVar2[lVar22]) {
        fVar63 = pfVar2[lVar22] + (pIVar12->IO).DeltaTime;
      }
    }
    pfVar2[lVar22] = fVar63;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x16);
  IVar24 = pIVar12->NavInitResultId;
  if (((IVar24 != 0) &&
      ((pIVar12->NavDisableHighlight != true || (pIVar12->NavInitRequestFromMove == true)))) &&
     (pIVar12->NavWindow != (ImGuiWindow *)0x0)) {
    IVar35 = pIVar12->NavLayer;
    if (pIVar12->NavInitRequestFromMove == true) {
      SetNavID(IVar24,IVar35);
      IVar44 = (pIVar12->NavInitResultRectRel).Max;
      pIVar6 = &pIVar12->NavWindow->NavRectRel[(int)IVar35].Min;
      *pIVar6 = (pIVar12->NavInitResultRectRel).Min;
      pIVar6[1] = IVar44;
      pIVar12->NavMousePosDirty = true;
      pIVar12->NavDisableHighlight = false;
      pIVar12->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar24,IVar35);
    }
    IVar44 = (pIVar12->NavInitResultRectRel).Max;
    pIVar6 = &pIVar12->NavWindow->NavRectRel[pIVar12->NavLayer].Min;
    *pIVar6 = (pIVar12->NavInitResultRectRel).Min;
    pIVar6[1] = IVar44;
  }
  pIVar12->NavInitRequest = false;
  pIVar12->NavInitRequestFromMove = false;
  pIVar12->NavInitResultId = 0;
  pIVar12->NavJustMovedToId = 0;
  pIVar39 = GImGui;
  if (pIVar12->NavMoveRequest == true) {
    IVar24 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar24 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar39->NavDisableHighlight = false;
        pIVar39->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar3 = &GImGui->NavMoveResultOther;
      pIVar30 = &GImGui->NavMoveResultLocal;
      if (IVar24 == 0) {
        pIVar30 = pIVar3;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20) != 0) &&
          (IVar24 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar24 != 0)) &&
         (IVar24 != GImGui->NavId)) {
        pIVar30 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar30 == pIVar3) {
LAB_0013c088:
        pIVar30 = pIVar3;
      }
      else if ((pIVar3->ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar63 = (GImGui->NavMoveResultOther).DistBox;
        fVar52 = pIVar30->DistBox;
        if (fVar52 <= fVar63) {
          if (((fVar63 != fVar52) || (NAN(fVar63) || NAN(fVar52))) ||
             (pfVar2 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar30->DistCenter < *pfVar2 || pIVar30->DistCenter == *pfVar2)) goto LAB_0013c08b;
        }
        goto LAB_0013c088;
      }
LAB_0013c08b:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) || (pIVar30->Window == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                      ,0x2113,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        IVar44 = pIVar30->Window->Pos;
        IVar46 = (pIVar30->RectRel).Min;
        IVar45 = (pIVar30->RectRel).Max;
        fVar63 = IVar44.x;
        IVar54.x = IVar46.x + fVar63;
        fVar52 = IVar44.y;
        IVar54.y = IVar46.y + fVar52;
        local_70.Max.x = IVar45.x + fVar63;
        local_70.Max.y = IVar45.y + fVar52;
        uStack_50 = 0;
        local_70.Min = IVar54;
        local_58 = local_70.Max;
        NavScrollToBringItemIntoView(pIVar30->Window,&local_70);
        pIVar23 = pIVar30->Window;
        IVar44 = CalcNextScrollFromScrollTargetAndClamp(pIVar23,false);
        fVar53 = (pIVar23->Scroll).x - IVar44.x;
        fVar59 = (pIVar23->Scroll).y - IVar44.y;
        fVar63 = (pIVar30->RectRel).Min.y;
        fVar52 = (pIVar30->RectRel).Max.x;
        fVar43 = (pIVar30->RectRel).Max.y;
        (pIVar30->RectRel).Min.x = (pIVar30->RectRel).Min.x + fVar53;
        (pIVar30->RectRel).Min.y = fVar63 + fVar59;
        (pIVar30->RectRel).Max.x = fVar52 + fVar53;
        (pIVar30->RectRel).Max.y = fVar43 + fVar59;
        if ((pIVar23->Flags & 0x1000000) != 0) {
          local_40.Min.x = fVar53 + IVar54.x;
          local_40.Min.y = fVar59 + local_70.Min.y;
          local_40.Max.x = local_58.x + fVar53;
          local_40.Max.y = local_70.Max.y + fVar59;
          NavScrollToBringItemIntoView(pIVar23->ParentWindow,&local_40);
        }
      }
      pIVar13 = GImGui;
      bVar40 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar40;
      if (bVar40) {
        pIVar13->ActiveIdTimer = 0.0;
        pIVar13->ActiveIdHasBeenPressedBefore = false;
        pIVar13->ActiveIdHasBeenEditedBefore = false;
      }
      pIVar13->ActiveId = 0;
      pIVar13->ActiveIdAllowNavDirFlags = 0;
      pIVar13->ActiveIdBlockNavInputFlags = 0;
      pIVar13->ActiveIdAllowOverlap = false;
      pIVar13->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar13->ActiveIdHasBeenEditedThisFrame = false;
      pIVar39->NavWindow = pIVar30->Window;
      IVar24 = pIVar30->ID;
      if (pIVar39->NavId != IVar24) {
        pIVar39->NavJustMovedToId = IVar24;
        pIVar39->NavJustMovedToMultiSelectScopeId = pIVar30->SelectScopeId;
      }
      IVar35 = pIVar39->NavLayer;
      SetNavID(IVar24,IVar35);
      IVar44 = (pIVar30->RectRel).Max;
      pIVar6 = &pIVar13->NavWindow->NavRectRel[(int)IVar35].Min;
      *pIVar6 = (pIVar30->RectRel).Min;
      pIVar6[1] = IVar44;
      pIVar13->NavMousePosDirty = true;
      pIVar13->NavDisableHighlight = false;
      pIVar13->NavDisableMouseHover = true;
      pIVar39->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar12->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar12->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x2022,"void ImGui::NavUpdate()");
    }
    if (((pIVar12->NavMoveResultLocal).ID == 0) && ((pIVar12->NavMoveResultOther).ID == 0)) {
      pIVar12->NavDisableHighlight = false;
    }
    pIVar12->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar12->NavMousePosDirty == true) && (pIVar12->NavIdIsAlive == true)) {
    if (((((pIVar12->IO).ConfigFlags & 4) != 0) &&
        (((((pIVar12->IO).BackendFlags & 4) != 0 && (pIVar12->NavDisableHighlight == false)) &&
         (pIVar12->NavDisableMouseHover == true)))) && (pIVar12->NavWindow != (ImGuiWindow *)0x0)) {
      IVar44 = NavCalcPreferredRefPos();
      (pIVar12->IO).MousePosPrev = IVar44;
      (pIVar12->IO).MousePos = IVar44;
      (pIVar12->IO).WantSetMousePos = true;
    }
    pIVar12->NavMousePosDirty = false;
  }
  pIVar12->NavIdIsAlive = false;
  pIVar12->NavJustTabbedId = 0;
  IVar35 = pIVar12->NavLayer;
  if (ImGuiNavLayer_Menu < IVar35) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x2038,"void ImGui::NavUpdate()");
  }
  pIVar23 = pIVar12->NavWindow;
  pIVar26 = pIVar23;
  if (pIVar23 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar26->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar26 != pIVar23) {
          pIVar26->NavLastChildNavWindow = pIVar23;
        }
        break;
      }
      ppIVar9 = &pIVar26->ParentWindow;
      pIVar26 = *ppIVar9;
    } while (*ppIVar9 != (ImGuiWindow *)0x0);
    if ((IVar35 == ImGuiNavLayer_Main) && (pIVar23->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar23->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar39 = GImGui;
  pIVar23 = GetTopMostPopupModal();
  if (pIVar23 == (ImGuiWindow *)0x0) {
    if (pIVar39->NavWindowingTargetAnim == (ImGuiWindow *)0x0) {
      if (pIVar39->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0013c3cc;
LAB_0013c3e9:
      fVar63 = (pIVar39->IO).NavInputsDownDuration[3];
      if ((((pIVar39->IO).KeyCtrl == true) && (iVar21 = (pIVar39->IO).KeyMap[0], -1 < iVar21)) &&
         (bVar40 = IsKeyPressed(iVar21,true), bVar40)) {
        bVar41 = (byte)(pIVar39->IO).ConfigFlags;
        uVar42 = (uint)bVar41;
        if (fVar63 == 0.0 || (bVar41 & 1) != 0) {
LAB_0013c443:
          pIVar23 = pIVar39->NavWindow;
          if ((pIVar23 != (ImGuiWindow *)0x0) ||
             (pIVar23 = FindWindowNavFocusable
                                  ((pIVar39->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
             pIVar23 != (ImGuiWindow *)0x0)) {
            pIVar39->NavWindowingTargetAnim = pIVar23;
            pIVar39->NavWindowingTarget = pIVar23;
            pIVar39->NavWindowingTimer = 0.0;
            pIVar39->NavWindowingHighlightAlpha = 0.0;
            pIVar39->NavWindowingToggleLayer = (bool)(~(byte)uVar42 & 1);
            pIVar39->NavInputSource = ImGuiInputSource_NavGamepad - (uVar42 & 1);
          }
        }
      }
      else if ((fVar63 == 0.0) && (!NAN(fVar63))) {
        uVar42 = 0;
        goto LAB_0013c443;
      }
      fVar63 = (pIVar39->IO).DeltaTime + pIVar39->NavWindowingTimer;
      pIVar39->NavWindowingTimer = fVar63;
      if (pIVar39->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0013c4cb;
LAB_0013c665:
      bVar40 = false;
      pIVar23 = (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0) {
        fVar63 = (pIVar39->IO).DeltaTime * -10.0 + pIVar39->NavWindowingHighlightAlpha;
        fVar63 = (float)(-(uint)(0.0 <= fVar63) & (uint)fVar63);
        pIVar39->NavWindowingHighlightAlpha = fVar63;
        if ((pIVar39->DimBgRatio <= 0.0) && (fVar63 <= 0.0)) {
          pIVar39->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
        goto LAB_0013c3e9;
      }
LAB_0013c3cc:
      fVar63 = (pIVar39->IO).DeltaTime + pIVar39->NavWindowingTimer;
      pIVar39->NavWindowingTimer = fVar63;
LAB_0013c4cb:
      IVar19 = pIVar39->NavInputSource;
      if (IVar19 != ImGuiInputSource_NavGamepad) {
LAB_0013c5d1:
        if (IVar19 == ImGuiInputSource_NavKeyboard) {
          fVar52 = (pIVar39->NavWindowingTimer + -0.2) / 0.05;
          fVar63 = 1.0;
          if (fVar52 <= 1.0) {
            fVar63 = fVar52;
          }
          fVar63 = (float)(~-(uint)(fVar52 < 0.0) & (uint)fVar63);
          uVar42 = -(uint)(fVar63 <= pIVar39->NavWindowingHighlightAlpha);
          pIVar39->NavWindowingHighlightAlpha =
               (float)(uVar42 & (uint)pIVar39->NavWindowingHighlightAlpha | ~uVar42 & (uint)fVar63);
          iVar21 = (GImGui->IO).KeyMap[0];
          if ((-1 < iVar21) && (bVar40 = IsKeyPressed(iVar21,true), bVar40)) {
            NavUpdateWindowingHighlightWindow((pIVar39->IO).KeyShift - 1 | 1);
          }
          if ((pIVar39->IO).KeyCtrl == false) {
            pIVar23 = pIVar39->NavWindowingTarget;
            bVar40 = false;
            goto LAB_0013c6b4;
          }
        }
        goto LAB_0013c665;
      }
      fVar52 = (fVar63 + -0.2) / 0.05;
      fVar63 = 1.0;
      if (fVar52 <= 1.0) {
        fVar63 = fVar52;
      }
      fVar63 = (float)(~-(uint)(fVar52 < 0.0) & (uint)fVar63);
      uVar42 = -(uint)(fVar63 <= pIVar39->NavWindowingHighlightAlpha);
      fVar43 = (float)(uVar42 & (uint)pIVar39->NavWindowingHighlightAlpha | ~uVar42 & (uint)fVar63);
      pIVar39->NavWindowingHighlightAlpha = fVar43;
      fVar63 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar52 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar21 = (uint)(0.0 < fVar63) - (uint)(0.0 < fVar52);
      if (iVar21 != 0) {
        NavUpdateWindowingHighlightWindow(iVar21);
        pIVar39->NavWindowingHighlightAlpha = 1.0;
        fVar43 = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) {
        if (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0013c665;
        IVar19 = pIVar39->NavInputSource;
        goto LAB_0013c5d1;
      }
      pbVar38 = &pIVar39->NavWindowingToggleLayer;
      *pbVar38 = (bool)(*pbVar38 & fVar43 < 1.0);
      if (*pbVar38 == false) {
        pIVar23 = pIVar39->NavWindowingTarget;
        bVar40 = false;
      }
      else {
        bVar40 = pIVar39->NavWindow != (ImGuiWindow *)0x0;
        pIVar23 = (ImGuiWindow *)0x0;
      }
      pIVar39->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
LAB_0013c6b4:
    pIVar13 = GImGui;
    fVar63 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar63 == 0.0) && (!NAN(fVar63))) {
      pIVar39->NavWindowingToggleLayer = true;
    }
    if ((((pIVar39->ActiveId == 0) || (pIVar39->ActiveIdAllowOverlap == true)) && (fVar63 < 0.0)) &&
       ((pIVar39->NavWindowingToggleLayer != false &&
        (0.0 <= (pIVar13->IO).NavInputsDownDurationPrev[0x10])))) {
      bVar16 = IsMousePosValid(&(pIVar39->IO).MousePos);
      bVar15 = IsMousePosValid(&(pIVar39->IO).MousePosPrev);
      bVar40 = (bool)(bVar15 == bVar16 | bVar40);
    }
    pIVar26 = pIVar39->NavWindowingTarget;
    if ((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 4) == 0)) {
      IVar19 = pIVar39->NavInputSource;
      if ((IVar19 == ImGuiInputSource_NavGamepad) ||
         ((IVar44.x = 0.0, IVar44.y = 0.0, IVar19 == ImGuiInputSource_NavKeyboard &&
          (IVar19 = ImGuiInputSource_Mouse, (pIVar39->IO).KeyShift == false)))) {
        IVar44 = GetNavInputAmount2d(IVar19,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar63 = IVar44.y;
      if (((IVar44.x != 0.0) || (fVar63 != 0.0)) || (NAN(fVar63))) {
        fVar52 = (pIVar39->IO).DisplayFramebufferScale.x;
        fVar43 = (pIVar39->IO).DisplayFramebufferScale.y;
        if (fVar43 <= fVar52) {
          fVar52 = fVar43;
        }
        fVar52 = (float)(int)(fVar52 * (pIVar39->IO).DeltaTime * 800.0);
        IVar46 = pIVar26->RootWindow->Pos;
        local_70.Min.x = IVar46.x + IVar44.x * fVar52;
        local_70.Min.y = IVar46.y + fVar63 * fVar52;
        SetWindowPos(pIVar26->RootWindow,&local_70.Min,1);
        pIVar39->NavDisableMouseHover = true;
        if (((pIVar39->NavWindowingTarget->Flags & 0x100) == 0) &&
           (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    pIVar13 = GImGui;
    if (pIVar23 != (ImGuiWindow *)0x0) {
      if ((pIVar39->NavWindow == (ImGuiWindow *)0x0) || (pIVar23 != pIVar39->NavWindow->RootWindow))
      {
        bVar16 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar16;
        if (bVar16) {
          pIVar13->ActiveIdTimer = 0.0;
          pIVar13->ActiveIdHasBeenPressedBefore = false;
          pIVar13->ActiveIdHasBeenEditedBefore = false;
        }
        pIVar13->ActiveId = 0;
        pIVar13->ActiveIdAllowNavDirFlags = 0;
        pIVar13->ActiveIdBlockNavInputFlags = 0;
        pIVar13->ActiveIdAllowOverlap = false;
        pIVar13->ActiveIdWindow = (ImGuiWindow *)0x0;
        pIVar13->ActiveIdHasBeenEditedThisFrame = false;
        pIVar39->NavDisableHighlight = false;
        pIVar39->NavDisableMouseHover = true;
        pIVar26 = pIVar23->NavLastChildNavWindow;
        if (pIVar23->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar26 = pIVar23;
        }
        ClosePopupsOverWindow(pIVar26,false);
        FocusWindow(pIVar26);
        if (pIVar26->NavLastIds[0] == 0) {
          NavInitWindow(pIVar26,false);
        }
        if ((pIVar26->DC).NavLayerActiveMask == 2) {
          pIVar39->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar39->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar40) && (pIVar23 = pIVar39->NavWindow, pIVar26 = pIVar23, pIVar23 != (ImGuiWindow *)0x0)
       ) {
      while (window = pIVar26, window->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar26 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
      }
      if (window != pIVar23) {
        FocusWindow(window);
        window->NavLastChildNavWindow = pIVar23;
        pIVar23 = pIVar39->NavWindow;
      }
      pIVar39->NavDisableHighlight = false;
      pIVar39->NavDisableMouseHover = true;
      IVar35 = ImGuiNavLayer_Main;
      if (((pIVar23->DC).NavLayerActiveMask & 2) != 0) {
        IVar35 = pIVar39->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar35);
    }
  }
  else {
    pIVar39->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bool)((uVar17 & 1) == 0 & (bVar11 ^ 1))) || (pIVar12->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar12->IO).NavActive = false;
LAB_0013c9ca:
    bVar40 = pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar40 = (pIVar12->NavWindow->Flags & 0x40000U) == 0;
    (pIVar12->IO).NavActive = bVar40;
    if (((!bVar40) || (pIVar12->NavId == 0)) ||
       (bVar40 = true, pIVar12->NavDisableHighlight != false)) goto LAB_0013c9ca;
  }
  (pIVar12->IO).NavVisible = bVar40;
  pIVar39 = GImGui;
  fVar63 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar63 == 0.0) && (!NAN(fVar63))) {
    if (pIVar12->ActiveId == 0) {
      pIVar23 = pIVar12->NavWindow;
      if (((pIVar23 == (ImGuiWindow *)0x0) || ((pIVar23->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar23->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar21 = (pIVar12->OpenPopupStack).Size;
        if ((long)iVar21 < 1) {
          if (pIVar12->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar23 != (ImGuiWindow *)0x0) && ((pIVar23->Flags & 0x5000000U) != 0x1000000)) {
              pIVar23->NavLastIds[0] = 0;
            }
            pIVar12->NavId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar12->OpenPopupStack).Data[(long)iVar21 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar21 + -1,true);
        }
      }
      else {
        if (pIVar23->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                        ,0x2054,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar23->ParentWindow);
        ppIVar9 = &GImGui->NavWindow;
        if (*ppIVar9 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                        ,0xae4,"void ImGui::SetNavID(ImGuiID, int)");
        }
        IVar24 = pIVar23->ChildId;
        GImGui->NavId = IVar24;
        (*ppIVar9)->NavLastIds[0] = IVar24;
        pIVar12->NavIdIsAlive = false;
        if (pIVar12->NavDisableMouseHover == true) {
          pIVar12->NavMousePosDirty = true;
        }
      }
    }
    else if ((pIVar12->ActiveIdBlockNavInputFlags & 2) == 0) {
      bVar40 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar40;
      if (bVar40) {
        pIVar39->ActiveIdTimer = 0.0;
        pIVar39->ActiveIdHasBeenPressedBefore = false;
        pIVar39->ActiveIdHasBeenEditedBefore = false;
      }
      pIVar39->ActiveId = 0;
      pIVar39->ActiveIdAllowNavDirFlags = 0;
      pIVar39->ActiveIdBlockNavInputFlags = 0;
      pIVar39->ActiveIdAllowOverlap = false;
      pIVar39->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar39->ActiveIdHasBeenEditedThisFrame = false;
    }
  }
  pIVar12->NavActivateId = 0;
  pIVar12->NavActivateDownId = 0;
  pIVar12->NavActivatePressedId = 0;
  pIVar39 = GImGui;
  pIVar12->NavInputId = 0;
  IVar24 = pIVar12->NavId;
  IVar18 = 0;
  if ((IVar24 == 0) || (pIVar12->NavDisableHighlight != false)) {
    IVar31 = 0;
LAB_0013cb8e:
    pIVar23 = pIVar12->NavWindow;
    bVar40 = pIVar23 == (ImGuiWindow *)0x0;
    if ((!bVar40) && ((pIVar23->Flags & 0x40000) != 0)) {
      pIVar12->NavDisableHighlight = true;
    }
    if (IVar18 != IVar31 && IVar31 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x2081,"void ImGui::NavUpdate()");
    }
  }
  else {
    IVar31 = 0;
    if (pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0013cb8e;
    IVar18 = 0;
    if (pIVar12->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar12->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          fVar63 = (GImGui->IO).NavInputsDownDuration[0];
          IVar14 = IVar24;
          if (0.0 <= fVar63) {
            IVar36 = pIVar12->ActiveId;
            if (IVar36 == 0 && fVar63 == 0.0) {
              pIVar12->NavActivateId = IVar24;
              pIVar12->NavActivateDownId = IVar24;
              IVar31 = IVar24;
            }
            else {
              if (IVar36 == 0) {
                pIVar12->NavActivateDownId = IVar24;
              }
              else {
                if (IVar36 != IVar24) goto LAB_0013d028;
                pIVar12->NavActivateDownId = IVar24;
              }
              IVar31 = 0;
              if ((fVar63 != 0.0) || (IVar31 = 0, NAN(fVar63))) goto LAB_0013e10a;
            }
            pIVar12->NavActivatePressedId = IVar24;
          }
          else {
            IVar36 = pIVar12->ActiveId;
            if ((IVar36 != 0) && (IVar36 != IVar24)) goto LAB_0013d028;
            pIVar12->NavActivateDownId = IVar24;
            IVar31 = 0;
          }
        }
        else {
          IVar36 = pIVar12->ActiveId;
          if (IVar36 == 0) {
            IVar31 = 0;
            IVar14 = 0;
          }
          else {
LAB_0013d028:
            IVar18 = 0;
            IVar31 = 0;
            IVar14 = 0;
            if (IVar36 != IVar24) goto LAB_0013cb8e;
          }
        }
LAB_0013e10a:
        IVar18 = IVar14;
        fVar63 = (pIVar39->IO).NavInputsDownDuration[2];
        if ((fVar63 == 0.0) && (!NAN(fVar63))) {
          pIVar12->NavInputId = IVar24;
        }
      }
      goto LAB_0013cb8e;
    }
    bVar40 = true;
    pIVar23 = (ImGuiWindow *)0x0;
  }
  pIVar12->NavMoveRequest = false;
  IVar24 = pIVar12->NavNextActivateId;
  if (IVar24 != 0) {
    pIVar12->NavActivateId = IVar24;
    pIVar12->NavActivateDownId = IVar24;
    pIVar12->NavActivatePressedId = IVar24;
    pIVar12->NavInputId = IVar24;
  }
  pIVar12->NavNextActivateId = 0;
  if (pIVar12->ActiveId == 0) {
    uVar42 = 0xffffffff;
  }
  else {
    uVar42 = pIVar12->ActiveIdAllowNavDirFlags;
  }
  if (pIVar12->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar12->NavMoveDir = -1;
    pIVar12->NavMoveRequestFlags = 0;
    IVar29 = -1;
    if (((!bVar40) && (uVar42 != 0 && pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar23->Flags & 0x40000) == 0)) {
      IVar29 = -1;
      if ((uVar42 & 1) != 0) {
        fVar63 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat);
        fVar52 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar52 + fVar63) {
          pIVar12->NavMoveDir = 0;
          IVar29 = 0;
        }
      }
      if ((uVar42 & 2) != 0) {
        fVar63 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat);
        fVar52 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar52 + fVar63) {
          pIVar12->NavMoveDir = 1;
          IVar29 = 1;
        }
      }
      if ((uVar42 & 4) != 0) {
        fVar63 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat);
        fVar52 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar52 + fVar63) {
          pIVar12->NavMoveDir = 2;
          IVar29 = 2;
        }
      }
      if ((uVar42 & 8) != 0) {
        fVar63 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat);
        fVar52 = GetNavInputAmount(0x15,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar52 + fVar63) {
          pIVar12->NavMoveDir = 3;
          IVar29 = 3;
        }
      }
    }
    pIVar12->NavMoveClipDir = IVar29;
  }
  else {
    if ((pIVar12->NavMoveDir == -1) || (pIVar12->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x209c,"void ImGui::NavUpdate()");
    }
    if (pIVar12->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x209d,"void ImGui::NavUpdate()");
    }
    pIVar12->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar39 = GImGui;
  fVar63 = 0.0;
  if ((((uVar17 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
     ((pIVar23 = GImGui->NavWindow, pIVar23 != (ImGuiWindow *)0x0 &&
      ((((pIVar23->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       (GImGui->NavLayer == ImGuiNavLayer_Main)))))) {
    bVar40 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar16 = IsKeyDown((pIVar39->IO).KeyMap[6]);
    if (((byte)uVar42 >> 2 & bVar40) != ((byte)uVar42 >> 3 & bVar16)) {
      if (((pIVar23->DC).NavLayerActiveMask != 0) || ((pIVar23->DC).NavHasScroll != true)) {
        fVar63 = GImGui->FontBaseSize * pIVar23->FontWindowScale;
        if (pIVar23->ParentWindow != (ImGuiWindow *)0x0) {
          fVar63 = fVar63 * pIVar23->ParentWindow->FontWindowScale;
        }
        fVar52 = (pIVar23->NavRectRel[pIVar39->NavLayer].Max.y -
                 pIVar23->NavRectRel[pIVar39->NavLayer].Min.y) +
                 (((pIVar23->InnerRect).Max.y - (pIVar23->InnerRect).Min.y) - fVar63);
        fVar52 = (float)(~-(uint)(fVar52 <= 0.0) & (uint)fVar52);
        bVar40 = IsKeyPressed((pIVar39->IO).KeyMap[5],true);
        if (bVar40) {
          pIVar39->NavMoveDir = 3;
          pIVar39->NavMoveClipDir = 2;
          pIVar39->NavMoveRequestFlags = 0x30;
          fVar63 = -fVar52;
        }
        else {
          bVar40 = IsKeyPressed((pIVar39->IO).KeyMap[6],true);
          fVar63 = 0.0;
          if (bVar40) {
            pIVar39->NavMoveDir = 2;
            pIVar39->NavMoveClipDir = 3;
            pIVar39->NavMoveRequestFlags = 0x30;
            fVar63 = fVar52;
          }
        }
        goto LAB_0013cddb;
      }
      bVar40 = IsKeyPressed((pIVar39->IO).KeyMap[5],true);
      if (bVar40) {
        (pIVar23->ScrollTarget).y =
             (pIVar23->Scroll).y - ((pIVar23->InnerRect).Max.y - (pIVar23->InnerRect).Min.y);
      }
      else {
        bVar40 = IsKeyPressed((pIVar39->IO).KeyMap[6],true);
        if (!bVar40) goto LAB_0013e281;
        (pIVar23->ScrollTarget).y =
             ((pIVar23->InnerRect).Max.y - (pIVar23->InnerRect).Min.y) + (pIVar23->Scroll).y;
      }
      (pIVar23->ScrollTargetCenterRatio).y = 0.0;
    }
LAB_0013e281:
    fVar63 = 0.0;
  }
LAB_0013cddb:
  uVar17 = pIVar12->NavMoveDir;
  if (uVar17 == 0xffffffff) {
    bVar41 = pIVar12->NavMoveRequest;
    if ((bVar41 & 1) != 0) goto LAB_0013ce0e;
    bVar40 = false;
  }
  else {
    pIVar12->NavMoveRequest = true;
    pIVar12->NavMoveDirLast = uVar17;
    bVar41 = 1;
LAB_0013ce0e:
    bVar40 = true;
    if (pIVar12->NavId == 0) {
      pIVar12->NavInitRequest = true;
      pIVar12->NavInitRequestFromMove = true;
      pIVar12->NavInitResultId = 0;
      pIVar12->NavDisableHighlight = false;
    }
  }
  pIVar39 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar38 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar38;
    if (*pbVar38 != false) goto LAB_0013cf2f;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_0013cf2f:
    if (pIVar39->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x1f6f,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar23 = pIVar12->NavWindow;
  if (((pIVar23 != (ImGuiWindow *)0x0) && ((pIVar23->Flags & 0x40000) == 0)) &&
     (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar52 = pIVar39->FontBaseSize * pIVar23->FontWindowScale;
    if (pIVar23->ParentWindow != (ImGuiWindow *)0x0) {
      fVar52 = fVar52 * pIVar23->ParentWindow->FontWindowScale;
    }
    fVar52 = (float)(int)(fVar52 * 100.0 * (pIVar12->IO).DeltaTime + 0.5);
    if (((pIVar23->DC).NavLayerActiveMask == 0) && ((bVar41 & (pIVar23->DC).NavHasScroll) == 1)) {
      if (uVar17 < 2) {
        lVar22 = 0x6c;
        lVar27 = 100;
        uVar42 = 0;
        lVar33 = 0x54;
      }
      else {
        if ((uVar17 & 0xfffffffe) != 2) goto LAB_0013d0c5;
        lVar22 = 0x70;
        lVar27 = 0x68;
        uVar42 = 2;
        lVar33 = 0x58;
      }
      *(float *)((long)&pIVar23->Name + lVar27) =
           (float)(int)(*(float *)(&DAT_0018e358 + (ulong)(uVar17 == uVar42) * 4) * fVar52 +
                       *(float *)((long)&pIVar23->Name + lVar33));
      *(undefined4 *)((long)&pIVar23->Name + lVar22) = 0;
    }
LAB_0013d0c5:
    IVar44 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar43 = IVar44.x;
    fVar53 = IVar44.y;
    if (((fVar43 != 0.0) || (NAN(fVar43))) && (pIVar23->ScrollbarX == true)) {
      (pIVar23->ScrollTarget).x = (float)(int)(fVar43 * fVar52 + (pIVar23->Scroll).x);
      (pIVar23->ScrollTargetCenterRatio).x = 0.0;
      pIVar12->NavMoveFromClampedRefRect = true;
    }
    if ((fVar53 != 0.0) || (NAN(fVar53))) {
      (pIVar23->ScrollTarget).y = (float)(int)(fVar53 * fVar52 + (pIVar23->Scroll).y);
      (pIVar23->ScrollTargetCenterRatio).y = 0.0;
      pIVar12->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar12->NavMoveResultLocal).ID = 0;
  (pIVar12->NavMoveResultLocal).SelectScopeId = 0;
  (pIVar12->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar12->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar12->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar12->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar12->NavMoveResultLocal).RectRel.Min.x = 3.4028235e+38;
  *(undefined8 *)&(pIVar12->NavMoveResultLocal).RectRel.Min.y = 0xff7fffff7f7fffff;
  (pIVar12->NavMoveResultLocal).RectRel.Max.y = -3.4028235e+38;
  (pIVar12->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar12->NavMoveResultLocalVisibleSet).SelectScopeId = 0;
  (pIVar12->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar12->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar12->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar12->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar12->NavMoveResultLocalVisibleSet).RectRel.Min.x = 3.4028235e+38;
  *(undefined8 *)&(pIVar12->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0xff7fffff7f7fffff;
  (pIVar12->NavMoveResultLocalVisibleSet).RectRel.Max.y = -3.4028235e+38;
  (pIVar12->NavMoveResultOther).ID = 0;
  (pIVar12->NavMoveResultOther).SelectScopeId = 0;
  (pIVar12->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar12->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar12->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar12->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar12->NavMoveResultOther).RectRel.Min.x = 3.4028235e+38;
  *(undefined8 *)&(pIVar12->NavMoveResultOther).RectRel.Min.y = 0xff7fffff7f7fffff;
  (pIVar12->NavMoveResultOther).RectRel.Max.y = -3.4028235e+38;
  if (((bVar40) && (pIVar12->NavMoveFromClampedRefRect == true)) &&
     (pIVar12->NavLayer == ImGuiNavLayer_Main)) {
    IVar44 = (pIVar23->InnerRect).Min;
    fVar52 = (pIVar23->Pos).x;
    fVar53 = (pIVar23->Pos).y;
    fVar59 = (IVar44.x - fVar52) + -1.0;
    fVar60 = (IVar44.y - fVar53) + -1.0;
    IVar44 = (pIVar23->InnerRect).Max;
    fVar43 = (IVar44.x - fVar52) + 1.0;
    fVar53 = (IVar44.y - fVar53) + 1.0;
    fVar52 = pIVar23->NavRectRel[0].Min.x;
    if ((((fVar52 < fVar59) || (pIVar23->NavRectRel[0].Min.y < fVar60)) ||
        (fVar43 < pIVar23->NavRectRel[0].Max.x)) || (fVar53 < pIVar23->NavRectRel[0].Max.y)) {
      fVar64 = pIVar39->FontBaseSize * pIVar23->FontWindowScale;
      if (pIVar23->ParentWindow != (ImGuiWindow *)0x0) {
        fVar64 = fVar64 * pIVar23->ParentWindow->FontWindowScale;
      }
      auVar65._0_4_ = fVar64 * 0.5;
      auVar66._0_4_ = fVar43 - fVar59;
      auVar66._4_4_ = fVar53 - fVar60;
      auVar66._8_8_ = 0;
      auVar65._4_4_ = auVar65._0_4_;
      auVar65._8_4_ = auVar65._0_4_;
      auVar65._12_4_ = auVar65._0_4_;
      auVar67 = minps(auVar66,auVar65);
      fVar59 = fVar59 + auVar67._0_4_;
      fVar60 = fVar60 + auVar67._4_4_;
      fVar64 = pIVar23->NavRectRel[0].Min.y;
      uVar17 = -(uint)(fVar59 <= fVar52);
      uVar42 = -(uint)(fVar60 <= fVar64);
      auVar57._0_4_ = fVar43 - auVar67._0_4_;
      auVar57._4_4_ = fVar53 - auVar67._4_4_;
      auVar57._8_4_ = 0.0 - auVar67._8_4_;
      auVar57._12_4_ = 0.0 - auVar67._12_4_;
      auVar67._8_8_ = 0;
      auVar67._0_4_ = pIVar23->NavRectRel[0].Max.x;
      auVar67._4_4_ = pIVar23->NavRectRel[0].Max.y;
      auVar57 = minps(auVar67,auVar57);
      pIVar23->NavRectRel[0].Min =
           (ImVec2)(CONCAT44(~uVar42 & (uint)fVar60,~uVar17 & (uint)fVar59) |
                   CONCAT44((uint)fVar64 & uVar42,(uint)fVar52 & uVar17));
      pIVar23->NavRectRel[0].Max = auVar57._0_8_;
      pIVar12->NavId = 0;
      pIVar23 = pIVar12->NavWindow;
    }
    pIVar12->NavMoveFromClampedRefRect = false;
  }
  if (pIVar23 == (ImGuiWindow *)0x0) {
    IVar46 = (pIVar39->IO).DisplaySize;
    fVar52 = 0.0;
    fVar43 = 0.0;
  }
  else {
    IVar44 = pIVar23->NavRectRel[pIVar12->NavLayer].Min;
    IVar46 = pIVar23->NavRectRel[pIVar12->NavLayer].Max;
    IVar45.x = 0.0;
    IVar45.y = 0.0;
    IVar55.x = 0.0;
    IVar55.y = 0.0;
    if (IVar44.y <= IVar46.y && IVar44.x <= IVar46.x) {
      IVar45 = IVar46;
      IVar55 = IVar44;
    }
    fVar53 = (pIVar23->Pos).x;
    fVar52 = IVar55.x + fVar53;
    fVar59 = (pIVar23->Pos).y;
    fVar43 = IVar55.y + fVar59;
    IVar46.x = IVar45.x + fVar53;
    IVar46.y = IVar45.y + fVar59;
  }
  (pIVar12->NavScoringRectScreen).Min.y = fVar43 + fVar63;
  fVar59 = IVar46.y + fVar63;
  (pIVar12->NavScoringRectScreen).Max.y = fVar59;
  fVar53 = fVar52 + 1.0;
  if (IVar46.x <= fVar52 + 1.0) {
    fVar53 = IVar46.x;
  }
  (pIVar12->NavScoringRectScreen).Min.x = fVar53;
  (pIVar12->NavScoringRectScreen).Max.x = fVar53;
  if (fVar59 < fVar43 + fVar63) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x20eb,"void ImGui::NavUpdate()");
  }
  pIVar12->NavScoringCount = 0;
  pIVar6 = &(pIVar39->IO).MousePos;
  bVar40 = IsMousePosValid(pIVar6);
  if (bVar40) {
    IVar44 = (pIVar39->IO).MousePos;
    IVar47.x = (float)(int)IVar44.x;
    IVar47.y = (float)(int)IVar44.y;
    pIVar39->LastValidMousePos = IVar47;
    (pIVar39->IO).MousePos = IVar47;
  }
  bVar40 = IsMousePosValid(pIVar6);
  if ((bVar40) && (bVar40 = IsMousePosValid(&(pIVar39->IO).MousePosPrev), bVar40)) {
    IVar44 = (pIVar39->IO).MousePos;
    IVar46 = (pIVar39->IO).MousePosPrev;
    IVar48.x = IVar44.x - IVar46.x;
    IVar48.y = IVar44.y - IVar46.y;
    (pIVar39->IO).MouseDelta = IVar48;
    if (((IVar48.x != 0.0) || (NAN(IVar48.x))) || ((IVar48.y != 0.0 || (NAN(IVar48.y))))) {
      pIVar39->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar39->IO).MouseDelta.x = 0.0;
    (pIVar39->IO).MouseDelta.y = 0.0;
  }
  (pIVar39->IO).MousePosPrev = (pIVar39->IO).MousePos;
  lVar22 = 0;
  do {
    if ((pIVar39->IO).MouseDown[lVar22] == true) {
      fVar63 = (pIVar39->IO).MouseDownDuration[lVar22];
      pbVar38 = (pIVar39->IO).MouseClicked + lVar22;
      *pbVar38 = fVar63 < 0.0;
      pbVar38[10] = false;
      (pIVar39->IO).MouseDownDurationPrev[lVar22] = fVar63;
      if (0.0 <= fVar63) {
        (pIVar39->IO).MouseDownDuration[lVar22] = fVar63 + (pIVar39->IO).DeltaTime;
        (pIVar39->IO).MouseDoubleClicked[lVar22] = false;
        bVar40 = IsMousePosValid(pIVar6);
        auVar51 = ZEXT816(0);
        if (bVar40) {
          IVar44 = (pIVar39->IO).MousePos;
          IVar46 = (pIVar39->IO).MouseClickedPos[lVar22];
          auVar51._0_4_ = IVar44.x - IVar46.x;
          auVar51._4_4_ = IVar44.y - IVar46.y;
          auVar51._8_8_ = 0;
        }
        fVar63 = (pIVar39->IO).MouseDragMaxDistanceSqr[lVar22];
        fVar52 = auVar51._0_4_ * auVar51._0_4_ + auVar51._4_4_ * auVar51._4_4_;
        uVar17 = -(uint)(fVar52 <= fVar63);
        (pIVar39->IO).MouseDragMaxDistanceSqr[lVar22] =
             (float)(~uVar17 & (uint)fVar52 | (uint)fVar63 & uVar17);
        IVar44 = (pIVar39->IO).MouseDragMaxDistanceAbs[lVar22];
        auVar61._0_8_ = auVar51._0_8_ ^ 0x8000000080000000;
        auVar61._8_4_ = auVar51._8_4_ ^ 0x80000000;
        auVar61._12_4_ = auVar51._12_4_ ^ 0x80000000;
        auVar57 = maxps(auVar61,auVar51);
        fVar63 = IVar44.x;
        fVar52 = IVar44.y;
        uVar17 = -(uint)(auVar57._0_4_ <= fVar63);
        uVar42 = -(uint)(auVar57._4_4_ <= fVar52);
        pIVar7 = (pIVar39->IO).MouseDragMaxDistanceAbs + lVar22;
        pIVar7->x = (float)(~uVar17 & (uint)auVar57._0_4_ | (uint)fVar63 & uVar17);
        pIVar7->y = (float)(~uVar42 & (uint)auVar57._4_4_ | (uint)fVar52 & uVar42);
      }
      else {
        (pIVar39->IO).MouseDownDuration[lVar22] = 0.0;
        (pIVar39->IO).MouseDoubleClicked[lVar22] = false;
        dVar49 = pIVar39->Time;
        if ((float)(dVar49 - (pIVar39->IO).MouseClickedTime[lVar22]) <
            (pIVar39->IO).MouseDoubleClickTime) {
          bVar40 = IsMousePosValid(pIVar6);
          fVar63 = 0.0;
          fVar52 = 0.0;
          if (bVar40) {
            IVar44 = (pIVar39->IO).MousePos;
            IVar46 = (pIVar39->IO).MouseClickedPos[lVar22];
            fVar63 = IVar44.x - IVar46.x;
            fVar52 = IVar44.y - IVar46.y;
          }
          fVar43 = (pIVar39->IO).MouseDoubleClickMaxDist;
          dVar49 = -3.4028234663852886e+38;
          if (fVar63 * fVar63 + fVar52 * fVar52 < fVar43 * fVar43) {
            (pIVar39->IO).MouseDoubleClicked[lVar22] = true;
            dVar49 = -3.4028234663852886e+38;
          }
        }
        (pIVar39->IO).MouseClickedTime[lVar22] = dVar49;
        (pIVar39->IO).MouseClickedPos[lVar22] = (pIVar39->IO).MousePos;
        (pIVar39->IO).MouseDownWasDoubleClick[lVar22] = (pIVar39->IO).MouseDoubleClicked[lVar22];
        pIVar7 = (pIVar39->IO).MouseDragMaxDistanceAbs + lVar22;
        pIVar7->x = 0.0;
        pIVar7->y = 0.0;
        (pIVar39->IO).MouseDragMaxDistanceSqr[lVar22] = 0.0;
      }
    }
    else {
      (pIVar39->IO).MouseClicked[lVar22] = false;
      fVar63 = (pIVar39->IO).MouseDownDuration[lVar22];
      (pIVar39->IO).MouseReleased[lVar22] = 0.0 <= fVar63;
      pbVar38 = (pIVar39->IO).MouseClicked + lVar22;
      (pIVar39->IO).MouseDownDurationPrev[lVar22] = fVar63;
      (pIVar39->IO).MouseDownDuration[lVar22] = -1.0;
      (pIVar39->IO).MouseDoubleClicked[lVar22] = false;
    }
    pIVar12 = local_60;
    if (((pIVar39->IO).MouseDown[lVar22] == false) && ((pIVar39->IO).MouseReleased[lVar22] == false)
       ) {
      (pIVar39->IO).MouseDownWasDoubleClick[lVar22] = false;
    }
    if (*pbVar38 == true) {
      pIVar39->NavDisableMouseHover = false;
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 5);
  fVar63 = (local_60->IO).DeltaTime;
  iVar21 = local_60->FramerateSecPerFrameIdx;
  local_60->FramerateSecPerFrameAccum =
       (fVar63 - local_60->FramerateSecPerFrame[iVar21]) + local_60->FramerateSecPerFrameAccum;
  local_60->FramerateSecPerFrame[iVar21] = fVar63;
  iVar20 = iVar21 + (int)((ulong)((long)(iVar21 + 1) * -0x77777777) >> 0x20) + 1;
  local_60->FramerateSecPerFrameIdx = iVar21 + 1 + ((iVar20 >> 6) - (iVar20 >> 0x1f)) * -0x78;
  uVar17 = -(uint)(0.0 < local_60->FramerateSecPerFrameAccum);
  (local_60->IO).Framerate =
       (float)(~uVar17 & 0x7f7fffff |
              (uint)(1.0 / (local_60->FramerateSecPerFrameAccum / 120.0)) & uVar17);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar23 = GetTopMostPopupModal();
  if ((pIVar23 != (ImGuiWindow *)0x0) ||
     ((pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar12->NavWindowingHighlightAlpha)))) {
    fVar63 = (pIVar12->IO).DeltaTime * 6.0 + pIVar12->DimBgRatio;
    if (1.0 <= fVar63) {
      fVar63 = 1.0;
    }
    pIVar12->DimBgRatio = fVar63;
  }
  else {
    fVar63 = (pIVar12->IO).DeltaTime * -10.0 + pIVar12->DimBgRatio;
    pIVar12->DimBgRatio = (float)(-(uint)(0.0 <= fVar63) & (uint)fVar63);
  }
  pIVar12->MouseCursor = 0;
  pIVar12->WantTextInputNextFrame = -1;
  pIVar12->WantCaptureMouseNextFrame = -1;
  pIVar12->WantCaptureKeyboardNextFrame = -1;
  (pIVar12->PlatformImePos).x = 1.0;
  pIVar39 = GImGui;
  (pIVar12->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar40 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar40) &&
        (fVar63 = (pIVar39->IO).MouseDragThreshold,
        fVar52 = (pIVar39->IO).MousePos.x - (pIVar39->WheelingWindowRefMousePos).x,
        fVar43 = (pIVar39->IO).MousePos.y - (pIVar39->WheelingWindowRefMousePos).y,
        fVar63 * fVar63 < fVar52 * fVar52 + fVar43 * fVar43)) ||
       (pIVar39->WheelingWindowTimer <= 0.0)) {
      pIVar39->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar39->WheelingWindowTimer = 0.0;
    }
  }
  pIVar13 = GImGui;
  fVar63 = (pIVar39->IO).MouseWheel;
  if (((((fVar63 != 0.0) || (fVar52 = (pIVar39->IO).MouseWheelH, fVar52 != 0.0)) || (NAN(fVar52)))
      && ((pIVar23 = pIVar39->WheelingWindow, pIVar23 != (ImGuiWindow *)0x0 ||
          (pIVar23 = pIVar39->HoveredWindow, pIVar23 != (ImGuiWindow *)0x0)))) &&
     (pIVar23->Collapsed == false)) {
    if ((fVar63 != 0.0) || (NAN(fVar63))) {
      if ((pIVar39->IO).KeyCtrl == true) {
        if ((pIVar39->IO).FontAllowUserScaling == true) {
          if (GImGui->WheelingWindow != pIVar23) {
            GImGui->WheelingWindow = pIVar23;
            pIVar13->WheelingWindowRefMousePos = (pIVar13->IO).MousePos;
            pIVar13->WheelingWindowTimer = 2.0;
            fVar63 = (pIVar39->IO).MouseWheel;
          }
          fVar52 = pIVar23->FontWindowScale;
          fVar43 = fVar63 * 0.1 + fVar52;
          fVar63 = 2.5;
          if (fVar43 <= 2.5) {
            fVar63 = fVar43;
          }
          fVar63 = (float)(-(uint)(fVar43 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar43 < 0.5) & (uint)fVar63);
          pIVar23->FontWindowScale = fVar63;
          if ((pIVar23->Flags & 0x1000000) == 0) {
            fVar63 = fVar63 / fVar52;
            IVar44 = pIVar23->Size;
            auVar58._8_8_ = 0;
            auVar58._0_4_ = IVar44.x;
            auVar58._4_4_ = IVar44.y;
            IVar46 = (pIVar39->IO).MousePos;
            fVar52 = (pIVar23->Pos).x;
            fVar43 = (pIVar23->Pos).y;
            auVar62._0_4_ = (IVar46.x - fVar52) * (1.0 - fVar63) * IVar44.x;
            auVar62._4_4_ = (IVar46.y - fVar43) * (1.0 - fVar63) * IVar44.y;
            auVar62._8_8_ = 0;
            auVar57 = divps(auVar62,auVar58);
            local_70.Min.x = auVar57._0_4_ + fVar52;
            local_70.Min.y = auVar57._4_4_ + fVar43;
            SetWindowPos(pIVar23,&local_70.Min,0);
            IVar50.x = (float)(int)((pIVar23->Size).x * fVar63);
            IVar50.y = (float)(int)((pIVar23->Size).y * fVar63);
            IVar56.x = (float)(int)((pIVar23->SizeFull).x * fVar63);
            IVar56.y = (float)(int)((pIVar23->SizeFull).y * fVar63);
            pIVar23->Size = IVar50;
            pIVar23->SizeFull = IVar56;
          }
          goto LAB_0013d908;
        }
      }
      else if ((pIVar39->IO).KeyShift == false) {
        if (GImGui->WheelingWindow != pIVar23) {
          GImGui->WheelingWindow = pIVar23;
          pIVar13->WheelingWindowRefMousePos = (pIVar13->IO).MousePos;
          pIVar13->WheelingWindowTimer = 2.0;
        }
        uVar17 = pIVar23->Flags;
        while (((uVar17 >> 0x18 & 1) != 0 &&
               (((uVar17 & 0x210) == 0x10 ||
                ((fVar52 = (pIVar23->ScrollMax).y, fVar52 == 0.0 && (!NAN(fVar52)))))))) {
          pIVar23 = pIVar23->ParentWindow;
          uVar17 = pIVar23->Flags;
        }
        if ((uVar17 & 0x210) == 0) {
          fVar52 = ((pIVar23->InnerRect).Max.y - (pIVar23->InnerRect).Min.y) * 0.67;
          fVar43 = pIVar13->FontBaseSize * pIVar23->FontWindowScale;
          if (pIVar23->ParentWindow != (ImGuiWindow *)0x0) {
            fVar43 = fVar43 * pIVar23->ParentWindow->FontWindowScale;
          }
          fVar53 = fVar43 * 5.0;
          if (fVar52 <= fVar43 * 5.0) {
            fVar53 = fVar52;
          }
          (pIVar23->ScrollTarget).y = (pIVar23->Scroll).y - fVar63 * (float)(int)fVar53;
          (pIVar23->ScrollTargetCenterRatio).y = 0.0;
        }
      }
    }
    pIVar13 = GImGui;
    fVar63 = (pIVar39->IO).MouseWheelH;
    if (((fVar63 == 0.0) && (!NAN(fVar63))) || ((pIVar39->IO).KeyShift == true)) {
      fVar63 = (pIVar39->IO).MouseWheel;
      if (((fVar63 == 0.0) && (!NAN(fVar63))) || ((pIVar39->IO).KeyShift != true))
      goto LAB_0013d908;
    }
    if ((pIVar39->IO).KeyCtrl == false) {
      if (GImGui->WheelingWindow != pIVar23) {
        GImGui->WheelingWindow = pIVar23;
        pIVar13->WheelingWindowRefMousePos = (pIVar13->IO).MousePos;
        pIVar13->WheelingWindowTimer = 2.0;
      }
      uVar17 = pIVar23->Flags;
      while (((uVar17 >> 0x18 & 1) != 0 &&
             (((uVar17 & 0x210) == 0x10 ||
              ((fVar52 = (pIVar23->ScrollMax).x, fVar52 == 0.0 && (!NAN(fVar52)))))))) {
        pIVar23 = pIVar23->ParentWindow;
        uVar17 = pIVar23->Flags;
      }
      if ((uVar17 & 0x210) == 0) {
        fVar52 = ((pIVar23->InnerRect).Max.x - (pIVar23->InnerRect).Min.x) * 0.67;
        fVar43 = pIVar13->FontBaseSize * pIVar23->FontWindowScale;
        if (pIVar23->ParentWindow != (ImGuiWindow *)0x0) {
          fVar43 = fVar43 * pIVar23->ParentWindow->FontWindowScale;
        }
        fVar53 = fVar43 + fVar43;
        if (fVar52 <= fVar43 + fVar43) {
          fVar53 = fVar52;
        }
        (pIVar23->ScrollTarget).x = (pIVar23->Scroll).x - fVar63 * (float)(int)fVar53;
        (pIVar23->ScrollTargetCenterRatio).x = 0.0;
      }
    }
  }
LAB_0013d908:
  pIVar23 = pIVar12->NavWindow;
  if ((((pIVar23 == (ImGuiWindow *)0x0) || (pIVar23->Active != true)) ||
      ((pIVar23->Flags & 0x40000) != 0)) ||
     (((pIVar12->IO).KeyCtrl != false || (iVar21 = (GImGui->IO).KeyMap[0], iVar21 < 0)))) {
    pIVar12->FocusTabPressed = false;
  }
  else {
    bVar40 = IsKeyPressed(iVar21,true);
    pIVar12->FocusTabPressed = bVar40;
    if ((bVar40) && (pIVar12->ActiveId == 0)) {
      pIVar23 = pIVar12->NavWindow;
      pIVar12->FocusRequestNextWindow = pIVar23;
      pIVar12->FocusRequestNextCounterAll = 0x7fffffff;
      if ((pIVar12->NavId == 0) || (pIVar12->NavIdTabCounter == 0x7fffffff)) {
        iVar21 = -(uint)(pIVar12->IO).KeyShift;
      }
      else {
        iVar21 = pIVar12->NavIdTabCounter + (-(uint)(pIVar12->IO).KeyShift | 1) + 1;
      }
      pIVar12->FocusRequestNextCounterTab = iVar21;
      goto LAB_0013d9bf;
    }
  }
  pIVar23 = pIVar12->FocusRequestNextWindow;
LAB_0013d9bf:
  pIVar12->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar12->FocusRequestCurrCounterAll = 0x7fffffff;
  pIVar12->FocusRequestCurrCounterTab = 0x7fffffff;
  if (pIVar23 != (ImGuiWindow *)0x0) {
    pIVar12->FocusRequestCurrWindow = pIVar23;
    if ((pIVar12->FocusRequestNextCounterAll != 0x7fffffff) &&
       (iVar21 = (pIVar23->DC).FocusCounterAll, iVar21 != -1)) {
      pIVar12->FocusRequestCurrCounterAll =
           (pIVar12->FocusRequestNextCounterAll + iVar21 + 1) % (iVar21 + 1);
    }
    if ((pIVar12->FocusRequestNextCounterTab != 0x7fffffff) &&
       (iVar21 = (pIVar23->DC).FocusCounterTab, iVar21 != -1)) {
      pIVar12->FocusRequestCurrCounterTab =
           (pIVar12->FocusRequestNextCounterTab + iVar21 + 1) % (iVar21 + 1);
    }
    pIVar12->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar12->FocusRequestNextCounterAll = 0x7fffffff;
    pIVar12->FocusRequestNextCounterTab = 0x7fffffff;
  }
  pIVar12->NavIdTabCounter = 0x7fffffff;
  uVar17 = (pIVar12->WindowsFocusOrder).Size;
  if (uVar17 != (pIVar12->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xee7,"void ImGui::NewFrame()");
  }
  if ((ulong)uVar17 != 0) {
    uVar28 = 0;
    if (0 < (int)uVar17) {
      uVar28 = (ulong)uVar17;
    }
    uVar34 = 0;
    do {
      if (uVar28 == uVar34) {
        pcVar25 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_0013e2bd;
      }
      pIVar23 = (pIVar12->Windows).Data[uVar34];
      pIVar23->WasActive = pIVar23->Active;
      pIVar23->BeginCount = 0;
      pIVar23->Active = false;
      pIVar23->WriteAccessed = false;
      uVar34 = uVar34 + 1;
    } while (uVar17 != uVar34);
  }
  if ((pIVar12->NavWindow != (ImGuiWindow *)0x0) && (pIVar12->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar12->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + 1;
    }
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar9 = (pIVar12->CurrentWindowStack).Data;
    if (ppIVar9 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar9,(long)(pIVar12->CurrentWindowStack).Size << 3);
      ppIVar9 = (pIVar12->CurrentWindowStack).Data;
      if ((ppIVar9 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
    }
    (pIVar12->CurrentWindowStack).Data = __dest;
    (pIVar12->CurrentWindowStack).Capacity = 0;
  }
  (pIVar12->CurrentWindowStack).Size = 0;
  if ((pIVar12->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + 1;
    }
    __dest_00 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar10 = (pIVar12->BeginPopupStack).Data;
    if (pIVar10 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_00,pIVar10,(long)(pIVar12->BeginPopupStack).Size * 0x30);
      pIVar10 = (pIVar12->BeginPopupStack).Data;
      if ((pIVar10 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
    }
    (pIVar12->BeginPopupStack).Data = __dest_00;
    (pIVar12->BeginPopupStack).Capacity = 0;
  }
  (pIVar12->BeginPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar12->NavWindow,false);
  pIVar39 = GImGui;
  GImGui->DebugItemPickerBreakID = 0;
  if (pIVar39->DebugItemPickerActive == true) {
    uVar17 = pIVar39->HoveredIdPreviousFrame;
    pIVar39->MouseCursor = 7;
    iVar21 = (pIVar39->IO).KeyMap[0xe];
    if ((-1 < iVar21) && (bVar40 = IsKeyPressed(iVar21,true), bVar40)) {
      pIVar39->DebugItemPickerActive = false;
    }
    pIVar13 = GImGui;
    fVar63 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar63 != 0.0) || (NAN(fVar63))) {
      uVar42 = (uint)(uVar17 == 0);
    }
    else if (uVar17 == 0) {
      uVar42 = 1;
    }
    else {
      pIVar39->DebugItemPickerBreakID = uVar17;
      pIVar39->DebugItemPickerActive = false;
      uVar42 = 0;
    }
    pIVar5 = &pIVar13->NextWindowData;
    *(byte *)&pIVar5->Flags = (byte)pIVar5->Flags | 0x40;
    (pIVar13->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar17);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar42 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar39 = GImGui;
  }
  *(byte *)&(pIVar39->NextWindowData).Flags = (byte)(pIVar39->NextWindowData).Flags | 2;
  (pIVar39->NextWindowData).SizeVal.x = 400.0;
  (pIVar39->NextWindowData).SizeVal.y = 400.0;
  (pIVar39->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  pIVar12->FrameScopePushedImplicitWindow = true;
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    NewFrameSanityChecks();

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.FrameScopeActive = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterAll = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTab = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTab = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterAll = g.FocusRequestCurrCounterTab = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterAll != INT_MAX && window->DC.FocusCounterAll != -1)
            g.FocusRequestCurrCounterAll = ImModPositive(g.FocusRequestNextCounterAll, window->DC.FocusCounterAll + 1);
        if (g.FocusRequestNextCounterTab != INT_MAX && window->DC.FocusCounterTab != -1)
            g.FocusRequestCurrCounterTab = ImModPositive(g.FocusRequestNextCounterTab, window->DC.FocusCounterTab + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterAll = g.FocusRequestNextCounterTab = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    g.FrameScopePushedImplicitWindow = true;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}